

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dom.cpp
# Opt level: O3

string * __thiscall
crawler::TokenQueue::consumeElementSelector_abi_cxx11_
          (string *__return_storage_ptr__,TokenQueue *this)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  long *plVar6;
  undefined2 *local_b0;
  undefined8 local_a8;
  undefined2 local_a0;
  undefined1 local_9e;
  undefined2 *local_90;
  undefined8 local_88;
  undefined2 local_80 [8];
  undefined2 *local_70;
  undefined8 local_68;
  undefined2 local_60 [8];
  long *local_50 [2];
  long local_40 [2];
  
  uVar3 = (this->data)._M_string_length;
  uVar5 = this->pos;
  if (uVar5 < uVar3) {
    do {
      plVar6 = local_40;
      iVar1 = isalnum((int)(this->data)._M_dataplus._M_p[uVar5]);
      if (iVar1 == 0) {
        local_b0 = &local_a0;
        local_a0 = 0x7c2a;
        local_a8 = 2;
        local_9e = 0;
        local_90 = local_80;
        local_80[0] = 0x7c;
        local_88 = 1;
        local_70 = local_60;
        local_60[0] = 0x5f;
        local_68 = 1;
        local_40[0]._0_2_ = 0x2d;
        local_50[1] = (long *)0x1;
        local_50[0] = plVar6;
        pbVar2 = std::
                 __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_pred<crawler::TokenQueue::matchesAny<4ul>(std::array<std::__cxx11::string,4ul>)::_lambda(std::__cxx11::string_const&)_1_>>
                           (&local_b0,&stack0xffffffffffffffd0,this);
        lVar4 = -0x80;
        do {
          if (plVar6 != (long *)plVar6[-2]) {
            operator_delete((long *)plVar6[-2],*plVar6 + 1);
          }
          plVar6 = plVar6 + -4;
          lVar4 = lVar4 + 0x20;
        } while (lVar4 != 0);
        uVar5 = this->pos;
        if (pbVar2 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &stack0xffffffffffffffd0) break;
        uVar3 = (this->data)._M_string_length;
      }
      uVar5 = uVar5 + 1;
      this->pos = uVar5;
    } while (uVar5 < uVar3);
  }
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)this);
  return __return_storage_ptr__;
}

Assistant:

std::string crawler::TokenQueue::consumeElementSelector() {
  return consumeByPredicate([this]() -> bool {
    return matchesAny(std::array<std::string, 4>({"*|", "|", "_", "-"}));
  });
}